

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plot.hpp
# Opt level: O2

void __thiscall sciplot::Plot::boxWidthRelative(Plot *this,double val)

{
  double local_58;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_58 = val;
  internal::str<double>(&local_50,&local_58);
  std::operator+(&local_30,&local_50," relative");
  std::__cxx11::string::operator=((string *)&this->m_boxwidth,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

inline auto Plot::boxWidthRelative(double val) -> void
{
    m_boxwidth = internal::str(val) + " relative";
}